

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O0

void __thiscall
aggreports::WritePerSampleExceedanceProbabilityTable
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,
          map<wheatkey,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
          *items,int eptype,int eptype_tvar,
          map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
          *unusedperiodstoweighting,
          map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
          *mean_map)

{
  double dVar1;
  pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_> *this_00;
  bool bVar2;
  bool bVar3;
  size_type sVar4;
  reference ppVar5;
  reference plVar6;
  mapped_type *this_01;
  pointer ppVar7;
  double dVar8;
  long *plVar9;
  _Base_ptr current_return_period;
  float fVar10;
  code *local_1b8;
  _Self local_168;
  double local_160;
  double retperiod_1;
  iterator iter;
  double retperiod;
  lossval lp;
  iterator __end2;
  iterator __begin2;
  lossvec2 *__range2;
  double dStack_f0;
  bool largest_loss;
  double max_retperiod;
  double cumulative_weighting;
  float local_d8;
  int i;
  OASIS_FLOAT tvar;
  OASIS_FLOAT last_computed_loss;
  double last_computed_rp;
  size_t nextreturnperiodindex;
  pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_> *local_b0;
  lossvec2 *lpv;
  undefined1 local_98 [8];
  pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_> s;
  iterator __end1;
  iterator __begin1;
  map<wheatkey,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
  *__range1;
  map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
  tail;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  *unusedperiodstoweighting_local;
  int eptype_tvar_local;
  int eptype_local;
  map<wheatkey,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
  *items_local;
  vector<int,_std::allocator<int>_> *fileIDs_local;
  aggreports *this_local;
  
  tail._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)unusedperiodstoweighting;
  sVar4 = std::
          map<wheatkey,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
          ::size(items);
  if (sVar4 != 0) {
    std::
    map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
    ::map((map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
           *)&__range1);
    __end1 = std::
             map<wheatkey,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
             ::begin(items);
    s.second.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)std::
                  map<wheatkey,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
                  ::end(items);
    while (bVar2 = std::operator!=(&__end1,(_Self *)&s.second.
                                                  super__Vector_base<lossval,_std::allocator<lossval>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                  ), bVar2) {
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>
               ::operator*(&__end1);
      std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>::pair
                ((pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_> *)local_98,
                 ppVar5);
      local_b0 = &s;
      std::vector<lossval,_std::allocator<lossval>_>::rbegin
                ((vector<lossval,_std::allocator<lossval>_> *)&stack0xffffffffffffff48);
      std::vector<lossval,_std::allocator<lossval>_>::rend
                ((vector<lossval,_std::allocator<lossval>_> *)&nextreturnperiodindex);
      std::
      sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<lossval*,std::vector<lossval,std::allocator<lossval>>>>>
                ((reverse_iterator<__gnu_cxx::__normal_iterator<lossval_*,_std::vector<lossval,_std::allocator<lossval>_>_>_>
                  *)&stack0xffffffffffffff48,
                 (reverse_iterator<__gnu_cxx::__normal_iterator<lossval_*,_std::vector<lossval,_std::allocator<lossval>_>_>_>
                  *)&nextreturnperiodindex);
      this_00 = local_b0;
      last_computed_rp = 0.0;
      _tvar = 0.0;
      i = 0;
      local_d8 = 0.0;
      cumulative_weighting._4_4_ = 1;
      max_retperiod = 0.0;
      dStack_f0 = 0.0;
      bVar2 = false;
      __end2 = std::vector<lossval,_std::allocator<lossval>_>::begin
                         ((vector<lossval,_std::allocator<lossval>_> *)local_b0);
      lp._16_8_ = std::vector<lossval,_std::allocator<lossval>_>::end
                            ((vector<lossval,_std::allocator<lossval>_> *)this_00);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<lossval_*,_std::vector<lossval,_std::allocator<lossval>_>_>
                                         *)&lp.value), bVar3) {
        plVar6 = __gnu_cxx::
                 __normal_iterator<lossval_*,_std::vector<lossval,_std::allocator<lossval>_>_>::
                 operator*(&__end2);
        lp._0_8_ = plVar6->period_weighting;
        lp.period_weighting = *(double *)&plVar6->value;
        max_retperiod = (double)((float)(double)lp._0_8_ * (float)this->samplesize_) + max_retperiod
        ;
        if (((double)lp._0_8_ != 0.0) || (NAN((double)lp._0_8_))) {
          current_return_period = (_Base_ptr)(1.0 / max_retperiod);
          if (!bVar2) {
            dStack_f0 = (double)current_return_period + 0.0001;
            bVar2 = true;
          }
          if ((this->useReturnPeriodFile_ & 1U) == 0) {
            fVar10 = (local_d8 - lp.period_weighting._0_4_) / (float)cumulative_weighting._4_4_;
            this_01 = std::
                      map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                      ::operator[]((map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                                    *)&__range1,(key_type *)local_98);
            iter._M_node = current_return_period;
            std::vector<TVaR,_std::allocator<TVaR>_>::push_back(this_01,(value_type *)&iter);
            if (this->WritePSEPTOutput != 0 ||
                this->WritePSEPTOutput != 0 && *(long *)&this->field_0x168 != 0) {
              local_1b8 = (code *)this->WritePSEPTOutput;
              plVar9 = (long *)((long)&this->totalperiods_ + *(long *)&this->field_0x168);
              if (((ulong)local_1b8 & 1) != 0) {
                local_1b8 = *(code **)(local_1b8 + *plVar9 + -1);
              }
              (*local_1b8)(current_return_period,lp.period_weighting._0_4_,plVar9,fileIDs,
                           local_98._0_4_,local_98._4_4_,eptype);
            }
          }
          else {
            WriteReturnPeriodOut<std::map<wheatkey,std::vector<TVaR,std::allocator<TVaR>>,std::less<wheatkey>,std::allocator<std::pair<wheatkey_const,std::vector<TVaR,std::allocator<TVaR>>>>>>
                      (this,fileIDs,(size_t *)&last_computed_rp,(double *)&tvar,(OASIS_FLOAT *)&i,
                       (double)current_return_period,lp.period_weighting._0_4_,local_98._0_4_,eptype
                       ,local_98._4_4_,dStack_f0,cumulative_weighting._4_4_,local_d8,
                       (map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                        *)&__range1,this->WritePSEPTOutput,
                       *(map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                         **)&this->field_0x168);
            fVar10 = (local_d8 - lp.period_weighting._0_4_) / (float)cumulative_weighting._4_4_;
          }
          local_d8 = local_d8 - fVar10;
          cumulative_weighting._4_4_ = cumulative_weighting._4_4_ + 1;
        }
        __gnu_cxx::__normal_iterator<lossval_*,_std::vector<lossval,_std::allocator<lossval>_>_>::
        operator++(&__end2);
      }
      if ((this->useReturnPeriodFile_ & 1U) != 0) {
        retperiod_1 = (double)std::
                              map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                              ::begin((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                       *)tail._M_t._M_impl.super__Rb_tree_header._M_node_count);
        do {
          local_160 = 0.0;
          local_168._M_node =
               (_Base_ptr)
               std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::end((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                      *)tail._M_t._M_impl.super__Rb_tree_header._M_node_count);
          bVar2 = std::operator!=((_Self *)&retperiod_1,&local_168);
          if (bVar2) {
            ppVar7 = std::_Rb_tree_iterator<std::pair<const_int,_double>_>::operator->
                               ((_Rb_tree_iterator<std::pair<const_int,_double>_> *)&retperiod_1);
            max_retperiod = ppVar7->second * (double)this->samplesize_ + max_retperiod;
            local_160 = 1.0 / max_retperiod;
            std::_Rb_tree_iterator<std::pair<const_int,_double>_>::operator++
                      ((_Rb_tree_iterator<std::pair<const_int,_double>_> *)&retperiod_1);
          }
          WriteReturnPeriodOut<std::map<wheatkey,std::vector<TVaR,std::allocator<TVaR>>,std::less<wheatkey>,std::allocator<std::pair<wheatkey_const,std::vector<TVaR,std::allocator<TVaR>>>>>>
                    (this,fileIDs,(size_t *)&last_computed_rp,(double *)&tvar,(OASIS_FLOAT *)&i,
                     local_160,0.0,local_98._0_4_,eptype,local_98._4_4_,dStack_f0,
                     cumulative_weighting._4_4_,local_d8,
                     (map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                      *)&__range1,this->WritePSEPTOutput,
                     *(map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                       **)&this->field_0x168);
          dVar1 = last_computed_rp;
          local_d8 = local_d8 - local_d8 / (float)cumulative_weighting._4_4_;
          cumulative_weighting._4_4_ = cumulative_weighting._4_4_ + 1;
          dVar8 = (double)std::vector<int,_std::allocator<int>_>::size(&this->returnperiods_);
        } while ((ulong)dVar1 < (ulong)dVar8);
      }
      std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>::~pair
                ((pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_> *)local_98);
      std::
      _Rb_tree_iterator<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>
      ::operator++(&__end1);
    }
    if (((this->ordFlag_ & 1U) != 0) && (this->fout_[1] != (FILE *)0x0)) {
      WriteTVaR(this,fileIDs,eptype_tvar,
                (map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                 *)&__range1);
    }
    std::
    map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
    ::~map((map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
            *)&__range1);
  }
  return;
}

Assistant:

void aggreports::WritePerSampleExceedanceProbabilityTable(
	const std::vector<int> &fileIDs, std::map<wheatkey, lossvec2> &items,
	int eptype, int eptype_tvar,
	std::map<int, double> &unusedperiodstoweighting,
	std::map<int, std::vector<mean_count>> *mean_map) {

  if (items.size() == 0) return;

#ifdef ORD_OUTPUT
  if (os_psept_exists_ == false) {
  	if (parquetFileNames_[PSEPT] != "") {
		os_psept_ = GetParquetStreamWriter(PSEPT);
		os_psept_exists_ = true;
	}
  }
#endif

  std::map<wheatkey, std::vector<TVaR>> tail;

  for (auto s : items) {
    lossvec2 &lpv = s.second;
    std::sort(lpv.rbegin(), lpv.rend());
    size_t nextreturnperiodindex = 0;
    double last_computed_rp = 0;
    OASIS_FLOAT last_computed_loss = 0;
    OASIS_FLOAT tvar = 0;
    int i = 1;
    double cumulative_weighting = 0;
    double max_retperiod = 0;
    bool largest_loss = false;

    for (auto lp : lpv) {
      cumulative_weighting += (OASIS_FLOAT)lp.period_weighting * samplesize_;

      if (lp.period_weighting) {
	double retperiod = 1 / cumulative_weighting;

	if (!largest_loss) {
	  max_retperiod = retperiod + 0.0001;   // Add for floating point errors
	  largest_loss = true;
	}

	if (useReturnPeriodFile_) {
#ifdef ORD_OUTPUT
	  WriteReturnPeriodOut(fileIDs, nextreturnperiodindex,
			       last_computed_rp, last_computed_loss, retperiod,
			       lp.value, s.first.summary_id, eptype,
			       s.first.sidx, max_retperiod, i, tvar, tail,
			       WritePSEPTOutput, os_psept_, mean_map);
#else
	  WriteReturnPeriodOut(fileIDs, nextreturnperiodindex,
			       last_computed_rp, last_computed_loss, retperiod,
			       lp.value, s.first.summary_id, eptype,
			       s.first.sidx, max_retperiod, i, tvar, tail,
			       WritePSEPTOutput, mean_map);
#endif
	  tvar = tvar - ((tvar - lp.value) / i);
	} else {
	  tvar = tvar - ((tvar - lp.value) / i);
	  tail[s.first].push_back({retperiod, tvar});
	  if (WritePSEPTOutput != nullptr) {
	    (this->*WritePSEPTOutput)(fileIDs, s.first.summary_id, s.first.sidx,
				      eptype, retperiod, lp.value);
	  }
#ifdef ORD_OUTPUT
	// TODO: Rather than checking for this on every iteration, it may be
	// more efficient to create a new class that inherits from
	// parquet::StreamWriter and implement the ios::setstate() function. In
	// this way, the state can be set to std::ios_base::badbit if needed.
	  if (parquetFileNames_[PSEPT] != "") {
	    WriteParquetOutput(os_psept_, s.first.summary_id, s.first.sidx,
			       eptype, retperiod, lp.value);
	  }
#endif
	}
	i++;
      }
    }
    if (useReturnPeriodFile_) {
      auto iter = unusedperiodstoweighting.begin();
      do {
	double retperiod = 0;
	if (iter != unusedperiodstoweighting.end()) {
	  cumulative_weighting += (iter->second * samplesize_);
	  retperiod = 1 / cumulative_weighting;
	  ++iter;
	}
#ifdef ORD_OUTPUT
	WriteReturnPeriodOut(fileIDs, nextreturnperiodindex, last_computed_rp,
			     last_computed_loss, retperiod, 0,
			     s.first.summary_id, eptype, s.first.sidx,
			     max_retperiod, i, tvar, tail, WritePSEPTOutput,
			     os_psept_, mean_map);
#else
	WriteReturnPeriodOut(fileIDs, nextreturnperiodindex, last_computed_rp,
			     last_computed_loss, retperiod, 0,
			     s.first.summary_id, eptype, s.first.sidx,
			     max_retperiod, i, tvar, tail, WritePSEPTOutput,
			     mean_map);
#endif
	tvar = tvar - (tvar / i);
	i++;
      } while (nextreturnperiodindex < returnperiods_.size());
    }
  }

  // Only write Tail Value at Risk (TVaR) for ORD output
  if (!ordFlag_) return;
  if (fout_[PSEPT] != nullptr) WriteTVaR(fileIDs, eptype_tvar, tail);
#ifdef ORD_OUTPUT
  if (parquetFileNames_[PSEPT] != "") WriteTVaR(os_psept_, eptype_tvar, tail);
#endif

}